

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImTriangulator::GetNextTriangle(ImTriangulator *this,uint *out_triangle)

{
  ImTriangulatorNode *this_00;
  int iVar1;
  ImTriangulator *in_RSI;
  ImTriangulator *in_RDI;
  ImTriangulatorNode *ear;
  int i;
  ImTriangulatorNode *node;
  undefined4 in_stack_ffffffffffffffe0;
  ImTriangulatorNode *in_stack_ffffffffffffffe8;
  
  if ((in_RDI->_Ears).Size == 0) {
    FlipNodeList(in_RDI);
    in_stack_ffffffffffffffe8 = in_RDI->_Nodes;
    for (iVar1 = in_RDI->_TrianglesLeft; -1 < iVar1; iVar1 = iVar1 + -1) {
      in_stack_ffffffffffffffe8->Type = ImTriangulatorNodeType_Convex;
      in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8->Next;
    }
    (in_RDI->_Reflexes).Size = 0;
    BuildReflexes((ImTriangulator *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    BuildEars((ImTriangulator *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    if ((in_RDI->_Ears).Size == 0) {
      *(in_RDI->_Ears).Data = in_RDI->_Nodes;
      (in_RDI->_Ears).Size = 1;
    }
  }
  iVar1 = (in_RDI->_Ears).Size + -1;
  (in_RDI->_Ears).Size = iVar1;
  this_00 = (in_RDI->_Ears).Data[iVar1];
  in_RSI->_TrianglesLeft = this_00->Prev->Index;
  *(int *)&in_RSI->field_0x4 = this_00->Index;
  *(int *)&in_RSI->_Nodes = this_00->Next->Index;
  ImTriangulatorNode::Unlink(this_00);
  if (this_00 == in_RDI->_Nodes) {
    in_RDI->_Nodes = this_00->Next;
  }
  ReclassifyNode(in_RSI,in_stack_ffffffffffffffe8);
  ReclassifyNode(in_RSI,in_stack_ffffffffffffffe8);
  in_RDI->_TrianglesLeft = in_RDI->_TrianglesLeft + -1;
  return;
}

Assistant:

void ImTriangulator::GetNextTriangle(unsigned int out_triangle[3])
{
    if (_Ears.Size == 0)
    {
        FlipNodeList();

        ImTriangulatorNode* node = _Nodes;
        for (int i = _TrianglesLeft; i >= 0; i--, node = node->Next)
            node->Type = ImTriangulatorNodeType_Convex;
        _Reflexes.Size = 0;
        BuildReflexes();
        BuildEars();

        // If we still don't have ears, it means geometry is degenerated.
        if (_Ears.Size == 0)
        {
            // Return first triangle available, mimicking the behavior of convex fill.
            IM_ASSERT(_TrianglesLeft > 0); // Geometry is degenerated
            _Ears.Data[0] = _Nodes;
            _Ears.Size    = 1;
        }
    }

    ImTriangulatorNode* ear = _Ears.Data[--_Ears.Size];
    out_triangle[0] = ear->Prev->Index;
    out_triangle[1] = ear->Index;
    out_triangle[2] = ear->Next->Index;

    ear->Unlink();
    if (ear == _Nodes)
        _Nodes = ear->Next;

    ReclassifyNode(ear->Prev);
    ReclassifyNode(ear->Next);
    _TrianglesLeft--;
}